

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked.h
# Opt level: O0

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 utf8::
 utf16to8<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,std::back_insert_iterator<std::__cxx11::string>>
           (__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> start,
           __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> end,
           back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           result)

{
  bool bVar1;
  uint16_t uVar2;
  reference psVar3;
  invalid_utf16 *piVar4;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> local_48;
  uint local_3c;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> _Stack_38;
  uint32_t trail_surrogate;
  uint local_2c;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  bStack_28;
  uint32_t cp;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result_local;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> end_local;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> start_local;
  
  bStack_28.container = result.container;
  result_local.container =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)end._M_current;
  end_local._M_current = start._M_current;
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&end_local,
                       (__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> *)
                       &result_local);
    if (!bVar1) {
      return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )bStack_28.container;
    }
    _Stack_38 = __gnu_cxx::__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>::
                operator++(&end_local,0);
    psVar3 = __gnu_cxx::__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>::
             operator*(&stack0xffffffffffffffc8);
    uVar2 = internal::mask16<short>(*psVar3);
    local_2c = (uint)uVar2;
    bVar1 = internal::is_lead_surrogate<unsigned_int>(local_2c);
    if (bVar1) {
      bVar1 = __gnu_cxx::operator!=
                        (&end_local,
                         (__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> *)
                         &result_local);
      if (!bVar1) {
        piVar4 = (invalid_utf16 *)__cxa_allocate_exception(0x10);
        invalid_utf16::invalid_utf16(piVar4,(uint16_t)local_2c);
        __cxa_throw(piVar4,&invalid_utf16::typeinfo,invalid_utf16::~invalid_utf16);
      }
      local_48 = __gnu_cxx::__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>
                 ::operator++(&end_local,0);
      psVar3 = __gnu_cxx::__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>::
               operator*(&local_48);
      uVar2 = internal::mask16<short>(*psVar3);
      local_3c = (uint)uVar2;
      bVar1 = internal::is_trail_surrogate<unsigned_int>(local_3c);
      if (!bVar1) {
        piVar4 = (invalid_utf16 *)__cxa_allocate_exception(0x10);
        invalid_utf16::invalid_utf16(piVar4,(uint16_t)local_3c);
        __cxa_throw(piVar4,&invalid_utf16::typeinfo,invalid_utf16::~invalid_utf16);
      }
      local_2c = local_2c * 0x400 + local_3c + 0xfca02400;
    }
    else {
      bVar1 = internal::is_trail_surrogate<unsigned_int>(local_2c);
      if (bVar1) {
        piVar4 = (invalid_utf16 *)__cxa_allocate_exception(0x10);
        invalid_utf16::invalid_utf16(piVar4,(uint16_t)local_2c);
        __cxa_throw(piVar4,&invalid_utf16::typeinfo,invalid_utf16::~invalid_utf16);
      }
    }
    bStack_28 = append<std::back_insert_iterator<std::__cxx11::string>>(local_2c,bStack_28);
  } while( true );
}

Assistant:

octet_iterator utf16to8 (u16bit_iterator start, u16bit_iterator end, octet_iterator result)
    {
        while (start != end) {
            uint32_t cp = utf8::internal::mask16(*start++);
            // Take care of surrogate pairs first
            if (utf8::internal::is_lead_surrogate(cp)) {
                if (start != end) {
                    uint32_t trail_surrogate = utf8::internal::mask16(*start++);
                    if (utf8::internal::is_trail_surrogate(trail_surrogate))
                        cp = (cp << 10) + trail_surrogate + internal::SURROGATE_OFFSET;
                    else
                        throw invalid_utf16(static_cast<uint16_t>(trail_surrogate));
                }
                else
                    throw invalid_utf16(static_cast<uint16_t>(cp));

            }
            // Lone trail surrogate
            else if (utf8::internal::is_trail_surrogate(cp))
                throw invalid_utf16(static_cast<uint16_t>(cp));

            result = utf8::append(cp, result);
        }
        return result;
    }